

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O3

int __thiscall
slang::ast::AssertionExpr::bind(AssertionExpr *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  AssertionExprKind AVar1;
  SyntaxNode *this_00;
  int iVar2;
  InvalidAssertionExpr *expr;
  undefined4 extraout_var;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar3;
  undefined4 extraout_var_00;
  long lVar4;
  undefined4 in_register_00000034;
  ASTContext *context;
  byte *pbVar5;
  ulong uVar6;
  SourceRange sourceRange;
  ASTContext ctx;
  ASTContext local_78;
  AssertionExpr *local_38;
  
  context = (ASTContext *)CONCAT44(in_register_00000034,__fd);
  local_78.scope.ptr = (context->scope).ptr;
  local_78.lookupIndex = context->lookupIndex;
  local_78._12_4_ = *(undefined4 *)&context->field_0xc;
  uVar6 = (context->flags).m_bits;
  local_78.instanceOrProc = context->instanceOrProc;
  local_78.firstTempVar = context->firstTempVar;
  local_78.randomizeDetails = context->randomizeDetails;
  local_78.assertionInstance = context->assertionInstance;
  local_78.flags.m_bits = uVar6 | 0x10;
  AVar1 = this->kind;
  if ((int)AVar1 < 0x169) {
    if ((int)AVar1 < 0x5d) {
      if ((int)AVar1 < 0x3e) {
        if (AVar1 != Unary) goto LAB_00488849;
        expr = (InvalidAssertionExpr *)
               AbortAssertionExpr::fromSyntax((AcceptOnPropertyExprSyntax *)this,&local_78);
      }
      else if (AVar1 == 0x3e) {
        expr = (InvalidAssertionExpr *)
               CaseAssertionExpr::fromSyntax((CasePropertyExprSyntax *)this,&local_78);
      }
      else {
        expr = (InvalidAssertionExpr *)
               ClockingAssertionExpr::fromSyntax((ClockingPropertyExprSyntax *)this,&local_78);
      }
    }
    else {
      if (((AVar1 - 0xd1 < 0x28) && ((0x8408000001U >> ((ulong)(AVar1 - 0xd1) & 0x3f) & 1) != 0)) ||
         (AVar1 != 0x5d)) goto LAB_00488849;
      expr = (InvalidAssertionExpr *)
             ConditionalAssertionExpr::fromSyntax((ConditionalPropertyExprSyntax *)this,&local_78);
    }
  }
  else if ((int)AVar1 < 0x1be) {
    if (AVar1 - 0x19f < 2) goto LAB_00488849;
    if (AVar1 != 0x169) {
      iVar2 = bind((int)this[1].syntax,(sockaddr *)&local_78,(uint)__addr & 0xff);
      expr = (InvalidAssertionExpr *)CONCAT44(extraout_var,iVar2);
      enforceNondegeneracy((AssertionExpr *)expr,context,__len,(SyntaxNode *)this);
      goto LAB_0048885b;
    }
    this_00 = *(SyntaxNode **)(this + 3);
    if (this_00 != (SyntaxNode *)0x0) {
      if (((uint)uVar6 >> 0x12 & 1) == 0) {
        sourceRange = slang::syntax::SyntaxNode::sourceRange(this_00);
        ASTContext::addDiag(&local_78,(DiagCode)0x200008,sourceRange);
        local_38 = (AssertionExpr *)0x0;
        expr = BumpAllocator::
               emplace<slang::ast::InvalidAssertionExpr,slang::ast::AssertionExpr_const*&>
                         (&(local_78.scope.ptr)->compilation->super_BumpAllocator,&local_38);
        goto LAB_0048885b;
      }
      pbVar5 = (byte *)((long)&(this_00[3].previewNode)->kind + 1);
      if ((byte *)0x1 < pbVar5) {
        uVar6 = (ulong)pbVar5 >> 1;
        lVar4 = 0;
        do {
          ppSVar3 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                              ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                               ((long)&(this_00[3].parent)->kind + lVar4));
          bind((AssertionExpr *)*ppSVar3,(int)&local_78,(sockaddr *)0x0,0);
          lVar4 = lVar4 + 0x30;
          uVar6 = uVar6 - 1;
        } while (uVar6 != 0);
      }
    }
    iVar2 = bind((AssertionExpr *)this[2].syntax,__fd,(sockaddr *)0x0,0);
    expr = (InvalidAssertionExpr *)CONCAT44(extraout_var_00,iVar2);
  }
  else if ((int)AVar1 < 0x1fd) {
    if (AVar1 == 0x1be) {
      expr = (InvalidAssertionExpr *)
             StrongWeakAssertionExpr::fromSyntax((StrongWeakPropertyExprSyntax *)this,&local_78);
    }
    else if (AVar1 == 500) {
      expr = (InvalidAssertionExpr *)
             UnaryAssertionExpr::fromSyntax((UnaryPropertyExprSyntax *)this,&local_78);
    }
    else {
      expr = (InvalidAssertionExpr *)
             UnaryAssertionExpr::fromSyntax((UnarySelectPropertyExprSyntax *)this,&local_78);
    }
  }
  else {
LAB_00488849:
    expr = (InvalidAssertionExpr *)
           BinaryAssertionExpr::fromSyntax((BinaryPropertyExprSyntax *)this,&local_78);
  }
  (expr->super_AssertionExpr).syntax = (SyntaxNode *)this;
LAB_0048885b:
  return (int)expr;
}

Assistant:

const AssertionExpr& AssertionExpr::bind(const PropertyExprSyntax& syntax,
                                         const ASTContext& context, bool allowDisable,
                                         NondegeneracyRequirement nondegRequirement) {
    ASTContext ctx(context);
    ctx.flags |= ASTFlags::AssignmentDisallowed;

    AssertionExpr* result;
    switch (syntax.kind) {
        case SyntaxKind::SimplePropertyExpr: {
            auto& seq = bind(*syntax.as<SimplePropertyExprSyntax>().expr, ctx, allowDisable);
            enforceNondegeneracy(seq, context, nondegRequirement, syntax);
            return seq;
        }
        case SyntaxKind::AndPropertyExpr:
        case SyntaxKind::OrPropertyExpr:
        case SyntaxKind::IffPropertyExpr:
        case SyntaxKind::UntilPropertyExpr:
        case SyntaxKind::SUntilPropertyExpr:
        case SyntaxKind::UntilWithPropertyExpr:
        case SyntaxKind::SUntilWithPropertyExpr:
        case SyntaxKind::ImpliesPropertyExpr:
        case SyntaxKind::ImplicationPropertyExpr:
        case SyntaxKind::FollowedByPropertyExpr:
            result = &BinaryAssertionExpr::fromSyntax(syntax.as<BinaryPropertyExprSyntax>(), ctx);
            break;
        case SyntaxKind::ParenthesizedPropertyExpr: {
            auto& ppe = syntax.as<ParenthesizedPropertyExprSyntax>();
            if (ppe.matchList) {
                // Similarly to the match list in a parenthesized sequence expression, during
                // argument checking this can be part of an event expression instead.
                if (ctx.flags.has(ASTFlags::AssertionInstanceArgCheck)) {
                    for (auto item : ppe.matchList->items)
                        AssertionExpr::bind(*item, ctx);
                }
                else {
                    ctx.addDiag(diag::InvalidCommaInPropExpr, ppe.matchList->sourceRange());
                    return badExpr(ctx.getCompilation(), nullptr);
                }
            }

            result = const_cast<AssertionExpr*>(&bind(*ppe.expr, context));
            break;
        }
        case SyntaxKind::ClockingPropertyExpr:
            result = &ClockingAssertionExpr::fromSyntax(syntax.as<ClockingPropertyExprSyntax>(),
                                                        ctx);
            break;
        case SyntaxKind::StrongWeakPropertyExpr:
            result = &StrongWeakAssertionExpr::fromSyntax(syntax.as<StrongWeakPropertyExprSyntax>(),
                                                          ctx);
            break;
        case SyntaxKind::UnaryPropertyExpr:
            result = &UnaryAssertionExpr::fromSyntax(syntax.as<UnaryPropertyExprSyntax>(), ctx);
            break;
        case SyntaxKind::UnarySelectPropertyExpr:
            result = &UnaryAssertionExpr::fromSyntax(syntax.as<UnarySelectPropertyExprSyntax>(),
                                                     ctx);
            break;
        case SyntaxKind::AcceptOnPropertyExpr:
            result = &AbortAssertionExpr::fromSyntax(syntax.as<AcceptOnPropertyExprSyntax>(), ctx);
            break;
        case SyntaxKind::ConditionalPropertyExpr:
            result = &ConditionalAssertionExpr::fromSyntax(
                syntax.as<ConditionalPropertyExprSyntax>(), ctx);
            break;
        case SyntaxKind::CasePropertyExpr:
            result = &CaseAssertionExpr::fromSyntax(syntax.as<CasePropertyExprSyntax>(), ctx);
            break;
        default:
            SLANG_UNREACHABLE;
    }

    result->syntax = &syntax;
    return *result;
}